

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt__tesselate_curve
              (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
              float y2,float objspace_flatness_squared,int n)

{
  float x2_00;
  float y2_00;
  float fVar1;
  float fVar2;
  float dy;
  float dx;
  float my;
  float mx;
  int n_local;
  float objspace_flatness_squared_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  int *num_points_local;
  stbtt__point *points_local;
  
  x2_00 = (x1 + x1 + x0 + x2) / 4.0;
  y2_00 = (y1 + y1 + y0 + y2) / 4.0;
  fVar1 = (x0 + x2) / 2.0 - x2_00;
  fVar2 = (y0 + y2) / 2.0 - y2_00;
  if (n < 0x11) {
    if (fVar1 * fVar1 + fVar2 * fVar2 <= objspace_flatness_squared) {
      stbtt__add_point(points,*num_points,x2,y2);
      *num_points = *num_points + 1;
    }
    else {
      stbtt__tesselate_curve
                (points,num_points,x0,y0,(x0 + x1) / 2.0,(y0 + y1) / 2.0,x2_00,y2_00,
                 objspace_flatness_squared,n + 1);
      stbtt__tesselate_curve
                (points,num_points,x2_00,y2_00,(x1 + x2) / 2.0,(y1 + y2) / 2.0,x2,y2,
                 objspace_flatness_squared,n + 1);
    }
  }
  return 1;
}

Assistant:

static int stbtt__tesselate_curve(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float objspace_flatness_squared, int n)
{
   // midpoint
   float mx = (x0 + 2*x1 + x2)/4;
   float my = (y0 + 2*y1 + y2)/4;
   // versus directly drawn line
   float dx = (x0+x2)/2 - mx;
   float dy = (y0+y2)/2 - my;
   if (n > 16) // 65536 segments on one curve better be enough!
      return 1;
   if (dx*dx+dy*dy > objspace_flatness_squared) { // half-pixel error allowed... need to be smaller if AA
      stbtt__tesselate_curve(points, num_points, x0,y0, (x0+x1)/2.0f,(y0+y1)/2.0f, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_curve(points, num_points, mx,my, (x1+x2)/2.0f,(y1+y2)/2.0f, x2,y2, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x2,y2);
      *num_points = *num_points+1;
   }
   return 1;
}